

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

idx_t duckdb::TemplatedUpdateNumericStatistics<int>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  int iVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  SelectionVector *pSVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  idx_t iVar8;
  idx_t row_idx;
  idx_t i;
  idx_t iVar9;
  
  pdVar2 = update->data;
  if ((update->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    pSVar4 = update->sel;
    iVar6 = *(int *)((long)&(stats->statistics).stats_union + 8);
    iVar7 = *(int *)((long)&(stats->statistics).stats_union + 0x18);
    for (iVar8 = 0; count != iVar8; iVar8 = iVar8 + 1) {
      psVar3 = pSVar4->sel_vector;
      iVar9 = iVar8;
      if (psVar3 != (sel_t *)0x0) {
        iVar9 = (idx_t)psVar3[iVar8];
      }
      iVar1 = *(int *)(pdVar2 + iVar9 * 4);
      if (iVar1 <= iVar6) {
        iVar6 = iVar1;
      }
      *(int *)((long)&(stats->statistics).stats_union + 8) = iVar6;
      if (iVar7 <= iVar1) {
        iVar7 = iVar1;
      }
      *(int *)((long)&(stats->statistics).stats_union + 0x18) = iVar7;
    }
    ::std::__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> *)
               &sel->selection_data);
    sel->sel_vector = (sel_t *)0x0;
    iVar8 = count;
  }
  else {
    SelectionVector::Initialize(sel,0x800);
    iVar8 = 0;
    for (iVar9 = 0; count != iVar9; iVar9 = iVar9 + 1) {
      psVar3 = update->sel->sel_vector;
      row_idx = iVar9;
      if (psVar3 != (sel_t *)0x0) {
        row_idx = (idx_t)psVar3[iVar9];
      }
      bVar5 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&(update->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      if (bVar5) {
        sel->sel_vector[iVar8] = (sel_t)iVar9;
        iVar8 = iVar8 + 1;
        iVar6 = *(int *)(pdVar2 + row_idx * 4);
        iVar7 = *(int *)((long)&(stats->statistics).stats_union + 8);
        iVar1 = *(int *)((long)&(stats->statistics).stats_union + 0x18);
        if (iVar6 <= iVar7) {
          iVar7 = iVar6;
        }
        *(int *)((long)&(stats->statistics).stats_union + 8) = iVar7;
        if (iVar6 < iVar1) {
          iVar6 = iVar1;
        }
        *(int *)((long)&(stats->statistics).stats_union + 0x18) = iVar6;
      }
    }
  }
  return iVar8;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}